

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

string * clask::html_encode(string *__return_storage_ptr__,string *value)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar3 = (value->_M_dataplus)._M_p;
  for (sVar2 = value->_M_string_length; sVar2 != 0; sVar2 = sVar2 - 1) {
    cVar1 = *pcVar3;
    if ((((cVar1 == '\"') || (cVar1 == '>')) || (cVar1 == '\'')) ||
       ((cVar1 == '<' || (cVar1 == '&')))) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar3);
    }
    pcVar3 = pcVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string html_encode(const std::string& value) {
  std::string buf;
  buf.reserve(value.size());
  for (const char & c : value) {
    switch (c) {
      case '&':  buf.append("&amp;");  break;
      case '\"': buf.append("&quot;"); break;
      case '\'': buf.append("&apos;"); break;
      case '<':  buf.append("&lt;");   break;
      case '>':  buf.append("&gt;");   break;
      default:   buf.append(&c, 1); break;
    }
  }
  return buf;
}